

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O1

void build_kd_tree_with_data_move(void)

{
  node *pnVar1;
  initializer_list<std::array<float,_3UL>_> __l;
  initializer_list<std::array<float,_3UL>_> __l_00;
  max_leaf_size_t max_leaf_size;
  space points;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree2;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree1;
  allocator_type local_189;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_188;
  undefined8 local_170;
  space_type local_168;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_148;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  undefined8 local_118;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_110;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_98;
  
  local_170 = 0xc;
  local_98.space_.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  local_98.space_.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4040000040000000;
  local_98.space_.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x40a0000040800000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&local_148,__l,(allocator_type *)&local_110);
  local_168.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_148.
       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_168.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_168.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_148.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_98,&local_168,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_170,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_110,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)local_128);
  if (local_168.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128._0_4_ = 0.0;
  local_128._4_4_ = 1.0;
  uStack_120 = 0x4040000040000000;
  local_118 = 0x40a0000040800000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_128;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&local_188,__l_00,&local_189);
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_110,&local_188,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_170,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)local_128,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_189);
  if (local_188.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_98);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_110);
  local_110.data_.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00107d98;
  while (local_110.data_.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_110.data_.allocator.resource_.head_)->prev;
    operator_delete(local_110.data_.allocator.resource_.head_,0x2008);
    local_110.data_.allocator.resource_.head_ = pnVar1;
  }
  if (local_110.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.space_.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.space_.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_98.data_.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00107d98;
  while (local_98.data_.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_98.data_.allocator.resource_.head_)->prev;
    operator_delete(local_98.data_.allocator.resource_.head_,0x2008);
    local_98.data_.allocator.resource_.head_ = pnVar1;
  }
  if (local_98.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.space_.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.space_.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void build_kd_tree_with_data_move() {
  pico_tree::max_leaf_size_t max_leaf_size = 12;
  auto points = make_point_set();

  pico_tree::kd_tree<space> tree1(std::move(points), max_leaf_size);

  pico_tree::kd_tree<space> tree2(make_point_set(), max_leaf_size);

  query_tree(tree1);

  query_tree(tree2);
}